

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O0

bool QWindowSystemHelper<QWindowSystemInterface::DefaultDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::TabletEvent,QWindow*,unsigned_long,QPointF,QPointF,QPointingDevice_const*,QFlags<Qt::MouseButton>,double,double,double,double,double,int,QFlags<Qt::KeyboardModifier>>
               (QWindow *args,unsigned_long args_1,QPointF args_2,QPointF args_3,
               QPointingDevice *args_4,QFlags<Qt::MouseButton> args_5,double args_6,double args_7,
               double args_8,double args_9,double args_10,int args_11,
               QFlags<Qt::KeyboardModifier> args_12)

{
  long lVar1;
  QPointF args_3_00;
  QPointF args_2_00;
  QPointF args_3_01;
  QPointF args_2_01;
  QFlags<Qt::MouseButton> in_ECX;
  double in_RDX;
  double in_RSI;
  double in_RDI;
  QFlags<Qt::KeyboardModifier> in_R9D;
  long in_FS_OFFSET;
  QWindow *in_XMM0_Qa;
  qreal in_XMM1_Qa;
  QPointingDevice *in_XMM2_Qa;
  qreal in_XMM3_Qa;
  double in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined1 local_bd;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  unsigned_long in_stack_ffffffffffffff88;
  QWindow *in_stack_ffffffffffffff90;
  QFlags<Qt::KeyboardModifier> in_stack_ffffffffffffffa8;
  QFlags<Qt::MouseButton> in_stack_ffffffffffffffac;
  qreal in_stack_ffffffffffffffb0;
  qreal in_stack_ffffffffffffffb8;
  qreal in_stack_ffffffffffffffc0;
  qreal in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (QWindowSystemInterfacePrivate::synchronousWindowSystemEvents) {
    args_2_01.yp = in_XMM1_Qa;
    args_2_01.xp = (qreal)in_XMM0_Qa;
    args_3_01.yp = in_XMM3_Qa;
    args_3_01.xp = (qreal)in_XMM2_Qa;
    local_bd = QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
               handleEvent<QWindowSystemInterfacePrivate::TabletEvent,QWindow*,unsigned_long,QPointF,QPointF,QPointingDevice_const*,QFlags<Qt::MouseButton>,double,double,double,double,double,int,QFlags<Qt::KeyboardModifier>>
                         (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,args_2_01,args_3_01,
                          (QPointingDevice *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_ECX,
                          in_RDI,in_RSI,in_RDX,in_XMM4_Qa,args_3.xp,(int)((ulong)in_XMM5_Qa >> 0x20)
                          ,in_R9D);
  }
  else {
    args_2_00.yp = in_stack_ffffffffffffffc8;
    args_2_00.xp = in_stack_ffffffffffffffc0;
    args_3_00.yp = in_stack_ffffffffffffffb8;
    args_3_00.xp = in_stack_ffffffffffffffb0;
    local_bd = QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
               handleEvent<QWindowSystemInterfacePrivate::TabletEvent,QWindow*,unsigned_long,QPointF,QPointF,QPointingDevice_const*,QFlags<Qt::MouseButton>,double,double,double,double,double,int,QFlags<Qt::KeyboardModifier>>
                         (in_XMM0_Qa,(unsigned_long)in_XMM3_Qa,args_2_00,args_3_00,in_XMM2_Qa,
                          in_stack_ffffffffffffffac,
                          (double)CONCAT44(in_ECX.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
                                           super_QFlagsStorage<Qt::MouseButton>.i,
                                           in_R9D.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>
                                           .super_QFlagsStorage<Qt::KeyboardModifier>.i),in_RDI,
                          in_RSI,in_RDX,in_XMM3_Qa,(int)((ulong)in_XMM4_Qa >> 0x20),
                          in_stack_ffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_bd;
  }
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::DefaultDelivery>::handleEvent(Args ...args)
{
    return QWindowSystemInterfacePrivate::synchronousWindowSystemEvents
        ? QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent<EventType>(args...)
        : QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
}